

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.h
# Opt level: O2

void __thiscall Loop::Loop(Loop *this,JitArenaAllocator *alloc,Func *func)

{
  uint32 uVar1;
  
  this->loopFlags = (LoopFlags)((byte)this->loopFlags & 0xfc);
  this->topFunc = func;
  (this->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
  super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)&this->blockList;
  (this->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount
  .count = 0;
  (this->blockList).allocator = &alloc->super_ArenaAllocator;
  (this->jsArrayKills).field_0.bits = '\0';
  this->parent = (Loop *)0x0;
  this->landingPad = (BasicBlock *)0x0;
  this->loopTopLabel = (LabelInstr *)0x0;
  this->symsRequiringCompensationToMergedValueInfoMap = (SymToValueInfoMap *)0x0;
  this->symsUsedBeforeDefined = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->likelyIntSymsUsedBeforeDefined = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->likelyNumberSymsUsedBeforeDefined = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->forceFloat64SymsOnEntry = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->symsDefInLoop = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->symsAssignedToInLoop = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->preservesNumberValue = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  JsUtil::
  BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->initialValueFieldMap,alloc,0);
  this->symClusterList = (LoopSymClusterList *)0x0;
  this->internallyDereferencedSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->loopCount = (LoopCount *)0x0;
  this->loopCountBasedBoundBaseSyms = (SymIdToStackSymMap *)0x0;
  this->inductionVariables = (InductionVariableSet *)0x0;
  this->dominatingLoopCountableBlock = (BasicBlock *)0x0;
  this->outwardSpeculationMaskInstrs =
       (SList<IR::ByteCodeUsesInstr_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  *(ushort *)&this->field_0x178 = (ushort)*(undefined4 *)&this->field_0x178 & 0xfc3e | 0x100;
  (this->regAlloc).regUseBv.word = 0;
  uVar1 = func->loopCount + 1;
  func->loopCount = uVar1;
  this->loopNumber = uVar1;
  return;
}

Assistant:

Loop(JitArenaAllocator * alloc, Func *func)
        : topFunc(func),
        blockList(alloc),
        parent(nullptr),
        landingPad(nullptr),
        loopTopLabel(nullptr),
        symsUsedBeforeDefined(nullptr),
        likelyIntSymsUsedBeforeDefined(nullptr),
        likelyNumberSymsUsedBeforeDefined(nullptr),
        forceFloat64SymsOnEntry(nullptr),
        symsDefInLoop(nullptr),
        symsAssignedToInLoop(nullptr),
        needImplicitCallBailoutChecksForJsArrayCheckHoist(false),
        inductionVariables(nullptr),
        preservesNumberValue(nullptr),
        dominatingLoopCountableBlock(nullptr),
        loopCount(nullptr),
        loopCountBasedBoundBaseSyms(nullptr),
        symClusterList(nullptr),
        internallyDereferencedSyms(nullptr),
        outwardSpeculationMaskInstrs(nullptr),
        isDead(false),
        allFieldsKilled(false),
        isLeaf(true),
        isProcessed(false),
        initialValueFieldMap(alloc),
        symsRequiringCompensationToMergedValueInfoMap(nullptr)
    {
        this->loopNumber = ++func->loopCount;
    }